

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.h
# Opt level: O0

void phyr::solveSurfaceNormal
               (Vector3f *dpdu,Vector3f *dpdv,Vector3f *d2pduu,Vector3f *d2pduv,Vector3f *d2pdvv,
               Normal3f *dndu,Normal3f *dndv)

{
  Vector3<double> *in_RCX;
  Vector3<double> *in_RDX;
  Vector3<double> *in_RSI;
  Vector3<double> *in_RDI;
  Vector3<double> *in_R8;
  double *in_R9;
  double *in_stack_00000008;
  double invFac;
  double g;
  double f;
  double e;
  Vector3f n;
  double G;
  double F;
  double E;
  Vector3<double> *in_stack_fffffffffffffea8;
  Vector3<double> *in_stack_fffffffffffffeb0;
  Vector3<double> *in_stack_fffffffffffffec0;
  Vector3<double> *in_stack_fffffffffffffed8;
  Vector3<double> *in_stack_fffffffffffffee0;
  Normal3<double> local_110 [3];
  Vector3<double> local_c8;
  Normal3<double> local_b0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  Vector3<double> local_60;
  double local_48;
  double local_40;
  double local_38;
  double *local_30;
  Vector3<double> *local_28;
  Vector3<double> *local_20;
  Vector3<double> *local_18;
  Vector3<double> *local_10;
  Vector3<double> *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = dot<double>(in_RDI,in_RDI);
  local_40 = dot<double>(local_8,local_10);
  local_48 = dot<double>(local_10,local_10);
  cross<double>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  normalize<double>(in_stack_fffffffffffffec0);
  local_80 = dot<double>(&local_60,local_18);
  local_88 = dot<double>(&local_60,local_20);
  local_90 = dot<double>(&local_60,local_28);
  local_98 = 1.0 / (local_38 * local_48 + -(local_40 * local_40));
  operator*((double)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  operator*((double)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Vector3<double>::operator+(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Normal3<double>::Normal3(&local_b0,&local_c8);
  *local_30 = local_b0.x;
  local_30[1] = local_b0.y;
  local_30[2] = local_b0.z;
  operator*((double)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  operator*((double)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Vector3<double>::operator+(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Normal3<double>::Normal3(local_110,(Vector3<double> *)&stack0xfffffffffffffed8);
  *in_stack_00000008 = local_110[0].x;
  in_stack_00000008[1] = local_110[0].y;
  in_stack_00000008[2] = local_110[0].z;
  return;
}

Assistant:

inline void solveSurfaceNormal(const Vector3f& dpdu, const Vector3f& dpdv,
                               const Vector3f& d2pduu, const Vector3f& d2pduv,
                               const Vector3f& d2pdvv, Normal3f* dndu, Normal3f* dndv) {
    // Compute coefficients for fundamental forms
    Real E = dot(dpdu, dpdu), F = dot(dpdu, dpdv), G = dot(dpdv, dpdv);
    Vector3f n = normalize(cross(dpdu, dpdv));
    Real e = dot(n, d2pduu), f = dot(n, d2pduv), g = dot(n, d2pdvv);

    // Compute dndu, dndv
    Real invFac = 1 / (E * G - F * F);
    *dndu = Normal3f((f * F - e * G) * invFac * dpdu +
                     (e * F - f * E) * invFac * dpdv);
    *dndv = Normal3f((g * f - f * G) * invFac * dpdu +
                     (f * F - g * E) * invFac * dpdv);
}